

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawWall4PalCommand::Execute(DrawWall4PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int pitch_00;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uchar *dest_00;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *puVar17;
  uint8_t *puVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  int iVar22;
  byte bVar23;
  int skipped;
  int pitch;
  uint32_t dc_wall_texturefrac3;
  uint32_t dc_wall_texturefrac2;
  uint32_t dc_wall_texturefrac1;
  uint32_t dc_wall_texturefrac0;
  uint32_t dc_wall_iscale3;
  uint32_t dc_wall_iscale2;
  uint32_t dc_wall_iscale1;
  uint32_t dc_wall_iscale0;
  uint8_t *buf3;
  uint8_t *buf2;
  uint8_t *buf1;
  uint8_t *buf0;
  uint8_t *pal3;
  uint8_t *pal2;
  uint8_t *pal1;
  uint8_t *pal0;
  uint32_t place;
  int bits;
  int count;
  uint8_t *dest;
  DrawerThread *thread_local;
  DrawWall4PalCommand *this_local;
  
  dest_00 = (this->super_PalWall4Command)._dest;
  iVar1 = (this->super_PalWall4Command)._fracbits;
  puVar14 = (this->super_PalWall4Command)._colormap[0];
  puVar15 = (this->super_PalWall4Command)._colormap[1];
  puVar16 = (this->super_PalWall4Command)._colormap[2];
  puVar17 = (this->super_PalWall4Command)._colormap[3];
  puVar18 = (this->super_PalWall4Command)._source[0];
  puVar19 = (this->super_PalWall4Command)._source[1];
  puVar20 = (this->super_PalWall4Command)._source[2];
  puVar21 = (this->super_PalWall4Command)._source[3];
  uVar2 = (this->super_PalWall4Command)._iscale[0];
  uVar3 = (this->super_PalWall4Command)._iscale[1];
  uVar4 = (this->super_PalWall4Command)._iscale[2];
  uVar5 = (this->super_PalWall4Command)._iscale[3];
  uVar6 = (this->super_PalWall4Command)._texturefrac[0];
  uVar7 = (this->super_PalWall4Command)._texturefrac[1];
  uVar8 = (this->super_PalWall4Command)._texturefrac[2];
  uVar9 = (this->super_PalWall4Command)._texturefrac[3];
  pitch_00 = (this->super_PalWall4Command)._pitch;
  place = DrawerThread::count_for_thread
                    (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y,
                     (this->super_PalWall4Command)._count);
  if (0 < (int)place) {
    iVar22 = DrawerThread::skipped_by_thread
                       (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y);
    _bits = DrawerThread::dest_for_thread<unsigned_char>
                      (thread,(this->super_PalWall4Command).super_DrawerCommand._dest_y,pitch_00,
                       dest_00);
    dc_wall_texturefrac2 = uVar2 * iVar22 + uVar6;
    dc_wall_texturefrac3 = uVar3 * iVar22 + uVar7;
    pitch = uVar4 * iVar22 + uVar8;
    skipped = uVar5 * iVar22 + uVar9;
    iVar22 = thread->num_cores;
    iVar10 = thread->num_cores;
    iVar11 = thread->num_cores;
    iVar12 = thread->num_cores;
    iVar13 = thread->num_cores;
    do {
      bVar23 = (byte)iVar1;
      *_bits = puVar14[puVar18[dc_wall_texturefrac2 >> (bVar23 & 0x1f)]];
      dc_wall_texturefrac2 = dc_wall_texturefrac2 + iVar22 * uVar2;
      _bits[1] = puVar15[puVar19[dc_wall_texturefrac3 >> (bVar23 & 0x1f)]];
      dc_wall_texturefrac3 = dc_wall_texturefrac3 + iVar10 * uVar3;
      _bits[2] = puVar16[puVar20[(uint)pitch >> (bVar23 & 0x1f)]];
      pitch = pitch + iVar11 * uVar4;
      _bits[3] = puVar17[puVar21[(uint)skipped >> (bVar23 & 0x1f)]];
      skipped = skipped + iVar12 * uVar5;
      _bits = _bits + iVar13 * pitch_00;
      place = place - 1;
    } while (place != 0);
  }
  return;
}

Assistant:

void DrawWall4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int bits = _fracbits;
		uint32_t place;
		auto pal0 = _colormap[0];
		auto pal1 = _colormap[1];
		auto pal2 = _colormap[2];
		auto pal3 = _colormap[3];
		auto buf0 = _source[0];
		auto buf1 = _source[1];
		auto buf2 = _source[2];
		auto buf3 = _source[3];
		auto dc_wall_iscale0 = _iscale[0];
		auto dc_wall_iscale1 = _iscale[1];
		auto dc_wall_iscale2 = _iscale[2];
		auto dc_wall_iscale3 = _iscale[3];
		auto dc_wall_texturefrac0 = _texturefrac[0];
		auto dc_wall_texturefrac1 = _texturefrac[1];
		auto dc_wall_texturefrac2 = _texturefrac[2];
		auto dc_wall_texturefrac3 = _texturefrac[3];
		auto pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		dc_wall_texturefrac0 += dc_wall_iscale0 * skipped;
		dc_wall_texturefrac1 += dc_wall_iscale1 * skipped;
		dc_wall_texturefrac2 += dc_wall_iscale2 * skipped;
		dc_wall_texturefrac3 += dc_wall_iscale3 * skipped;
		dc_wall_iscale0 *= thread->num_cores;
		dc_wall_iscale1 *= thread->num_cores;
		dc_wall_iscale2 *= thread->num_cores;
		dc_wall_iscale3 *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			dest[0] = pal0[buf0[(place = dc_wall_texturefrac0) >> bits]]; dc_wall_texturefrac0 = place + dc_wall_iscale0;
			dest[1] = pal1[buf1[(place = dc_wall_texturefrac1) >> bits]]; dc_wall_texturefrac1 = place + dc_wall_iscale1;
			dest[2] = pal2[buf2[(place = dc_wall_texturefrac2) >> bits]]; dc_wall_texturefrac2 = place + dc_wall_iscale2;
			dest[3] = pal3[buf3[(place = dc_wall_texturefrac3) >> bits]]; dc_wall_texturefrac3 = place + dc_wall_iscale3;
			dest += pitch;
		} while (--count);
	}